

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O2

void __thiscall GLFlat::DrawSubsectors(GLFlat *this,int pass,bool processlights,bool istrans)

{
  uint uVar1;
  subsector_t *psVar2;
  DWORD DVar3;
  sector_t *psVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  int i;
  long lVar6;
  int index;
  int iVar7;
  undefined8 *puVar8;
  int dli;
  uint local_34;
  
  uVar5 = CONCAT71(in_register_00000009,istrans) & 0xffffffff;
  dli = this->dynlightindex;
  FRenderState::Apply(&gl_RenderState);
  iVar7 = this->vboindex;
  lVar6 = 0;
  if (iVar7 < 0) {
    for (; psVar4 = this->sector, lVar6 < psVar4->subsectorcount; lVar6 = lVar6 + 1) {
      psVar2 = psVar4->subsectors[lVar6];
      if ((((gl_drawinfo->ss_renderflags).Array[((long)psVar2 - (long)subsectors) / 0x60] &
           this->renderflags) == 0 & ((byte)uVar5 ^ 1)) == 0) {
        if (processlights) {
          SetupSubsectorLights(this,0,psVar2,&dli);
        }
        DrawSubsector(this,psVar2);
      }
    }
  }
  else {
    local_34 = (uint)CONCAT71(in_register_00000009,istrans);
    for (; psVar4 = this->sector, lVar6 < psVar4->subsectorcount; lVar6 = lVar6 + 1) {
      psVar2 = psVar4->subsectors[lVar6];
      if (((gl_drawinfo->ss_renderflags).Array[((long)psVar2 - (long)subsectors) / 0x60] &
          this->renderflags) == 0 && (char)uVar5 == '\0') {
        DVar3 = psVar2->numlines;
      }
      else {
        if (processlights) {
          SetupSubsectorLights(this,0,psVar2,&dli);
        }
        (*_ptrc_glDrawArrays)(6,iVar7,psVar2->numlines);
        DVar3 = psVar2->numlines;
        flatvertices = flatvertices + DVar3;
        flatprimitives = flatprimitives + 1;
        uVar5 = (ulong)local_34;
      }
      iVar7 = iVar7 + DVar3;
    }
  }
  if ((this->renderflags & 4) == 0) {
    if ((this->renderflags & 1) == 0) {
      lVar6 = 0x98;
      uVar1 = (gl_drawinfo->otherceilingplanes).Count;
    }
    else {
      lVar6 = 0x88;
      uVar1 = (gl_drawinfo->otherfloorplanes).Count;
    }
    if ((uint)psVar4->sectornum < uVar1) {
      puVar8 = (undefined8 *)
               ((ulong)(uint)psVar4->sectornum * 8 + *(long *)(&gl_drawinfo->temporary + lVar6));
      goto LAB_003eb959;
    }
    for (puVar8 = (undefined8 *)0x0; puVar8 != (undefined8 *)0x0; puVar8 = (undefined8 *)*puVar8) {
      if (processlights) {
        SetupSubsectorLights(this,0,(subsector_t *)puVar8[1],&dli);
      }
      DrawSubsector(this,(subsector_t *)puVar8[1]);
LAB_003eb959:
    }
  }
  return;
}

Assistant:

void GLFlat::DrawSubsectors(int pass, bool processlights, bool istrans)
{
	int dli = dynlightindex;

	gl_RenderState.Apply();
	if (vboindex >= 0)
	{
		int index = vboindex;
		for (int i=0; i<sector->subsectorcount; i++)
		{
			subsector_t * sub = sector->subsectors[i];
				
			if (gl_drawinfo->ss_renderflags[sub-subsectors]&renderflags || istrans)
			{
				if (processlights) SetupSubsectorLights(GLPASS_ALL, sub, &dli);
				drawcalls.Clock();
				glDrawArrays(GL_TRIANGLE_FAN, index, sub->numlines);
				drawcalls.Unclock();
				flatvertices += sub->numlines;
				flatprimitives++;
			}
			index += sub->numlines;
		}
	}
	else
	{
		// Draw the subsectors belonging to this sector
		// (can this case even happen?)
		for (int i=0; i<sector->subsectorcount; i++)
		{
			subsector_t * sub = sector->subsectors[i];
			if (gl_drawinfo->ss_renderflags[sub-subsectors]&renderflags || istrans)
			{
				if (processlights) SetupSubsectorLights(GLPASS_ALL, sub, &dli);
				DrawSubsector(sub);
			}
		}
	}

	// Draw the subsectors assigned to it due to missing textures
	if (!(renderflags&SSRF_RENDER3DPLANES))
	{
		gl_subsectorrendernode * node = (renderflags&SSRF_RENDERFLOOR)?
			gl_drawinfo->GetOtherFloorPlanes(sector->sectornum) :
			gl_drawinfo->GetOtherCeilingPlanes(sector->sectornum);

		while (node)
		{
			if (processlights) SetupSubsectorLights(GLPASS_ALL, node->sub, &dli);
			DrawSubsector(node->sub);
			node = node->next;
		}
	}
}